

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ModuleHeaderSyntax::setChild
          (ModuleHeaderSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048304c + *(int *)(&DAT_0048304c + index * 4)))();
  return;
}

Assistant:

void ModuleHeaderSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: moduleKeyword = child.token(); return;
        case 1: lifetime = child.token(); return;
        case 2: name = child.token(); return;
        case 3: imports = child.node()->as<SyntaxList<PackageImportDeclarationSyntax>>(); return;
        case 4: parameters = child.node() ? &child.node()->as<ParameterPortListSyntax>() : nullptr; return;
        case 5: ports = child.node() ? &child.node()->as<PortListSyntax>() : nullptr; return;
        case 6: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}